

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 sqlite3ExprListFlags(ExprList *pList)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (pList == (ExprList *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = (ulong)(uint)pList->nExpr;
    if (pList->nExpr < 1) {
      uVar2 = uVar3;
    }
    uVar1 = 0;
    for (; uVar2 * 0x20 != uVar3; uVar3 = uVar3 + 0x20) {
      uVar1 = uVar1 | *(uint *)(*(long *)((long)&pList->a[0].pExpr + uVar3) + 4);
    }
  }
  return uVar1;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3ExprListFlags(const ExprList *pList){
  int i;
  u32 m = 0;
  if( pList ){
    for(i=0; i<pList->nExpr; i++){
       Expr *pExpr = pList->a[i].pExpr;
       assert( pExpr!=0 );
       m |= pExpr->flags;
    }
  }
  return m;
}